

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMAController.cpp
# Opt level: O3

void __thiscall Atari::ST::DMAController::DMAController(DMAController *this)

{
  Observer *pOVar1;
  WD1772 *this_00;
  uint uVar2;
  
  (this->super_Source).observer_ = (Observer *)0x0;
  pOVar1 = &this->super_Observer;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&PTR_wd1770_did_change_output_00596970;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_00596998;
  (this->super_Observer)._vptr_Observer = (_func_int **)&DAT_005969b0;
  (this->running_time_).super_WrappedInt<HalfCycles>.length_ = 0;
  this_00 = &this->fdc_;
  WD1772::WD1772(this_00);
  this->control_ = 0;
  this->delegate_ = (Delegate *)0x0;
  this->interrupt_line_ = false;
  this->bus_request_line_ = false;
  this->buffer_[0].is_full = false;
  this->address_ = 0;
  this->byte_count_ = 0;
  *(undefined8 *)&this->buffer_[1].is_full = 0;
  *(undefined2 *)((long)&this->bytes_received_ + 3) = 0;
  (this->fdc_).super_WD1770.delegate_ = &this->super_Delegate;
  (this->fdc_).super_WD1770.super_MFMController.super_Controller.super_Source.observer_ = pOVar1;
  uVar2 = (**(this->fdc_).super_WD1770.super_MFMController.super_Controller.super_Source.
             _vptr_Source)(this_00);
  (**pOVar1->_vptr_Observer)(pOVar1,this_00,(ulong)uVar2);
  return;
}

Assistant:

DMAController::DMAController() {
	fdc_.set_delegate(this);
	fdc_.set_clocking_hint_observer(this);
}